

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

bool el::Configurations::Parser::parseLine
               (string *line,string *currConfigStr,string *currLevelStr,Level *currLevel,
               Configurations *conf)

{
  ulong uVar1;
  byte bVar2;
  size_type sVar3;
  pointer pcVar4;
  char *pcVar5;
  Level *pLVar6;
  bool bVar7;
  int iVar8;
  Level LVar9;
  ulong uVar10;
  ostream *poVar11;
  undefined8 uVar12;
  bool bVar13;
  size_type sVar14;
  long lVar15;
  string currValue;
  stringstream internalInfoStream;
  ConfigurationType local_21c;
  long *local_218;
  long local_210;
  long local_208 [2];
  ulong local_1f8;
  string local_1f0;
  ulong local_1d0;
  Level *local_1c8;
  Configurations *local_1c0;
  long *local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  local_1f0._M_string_length = 0;
  local_1f0.field_2._M_local_buf[0] = '\0';
  local_1c8 = currLevel;
  local_1c0 = conf;
  base::utils::Str::rtrim(line);
  base::utils::Str::ltrim(line);
  std::__cxx11::string::_M_assign((string *)line);
  bVar7 = isComment(line);
  bVar13 = true;
  if (bVar7) goto LAB_00158818;
  ignoreComments(line);
  base::utils::Str::rtrim(line);
  base::utils::Str::ltrim(line);
  std::__cxx11::string::_M_assign((string *)line);
  if (line->_M_string_length == 0) goto LAB_00158818;
  bVar7 = isLevel(line);
  if (bVar7) {
    if (2 < line->_M_string_length) {
      std::__cxx11::string::substr((ulong)local_1b8,(ulong)line);
      std::__cxx11::string::operator=((string *)currLevelStr,(string *)local_1b8);
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0],local_1a8[0] + 1);
      }
      sVar3 = currLevelStr->_M_string_length;
      if (sVar3 != 0) {
        pcVar4 = (currLevelStr->_M_dataplus)._M_p;
        sVar14 = 0;
        do {
          iVar8 = toupper((int)pcVar4[sVar14]);
          pcVar4[sVar14] = (char)iVar8;
          sVar14 = sVar14 + 1;
        } while (sVar3 != sVar14);
      }
      std::__cxx11::string::_M_assign((string *)currLevelStr);
      base::utils::Str::rtrim(currLevelStr);
      base::utils::Str::ltrim(currLevelStr);
      std::__cxx11::string::_M_assign((string *)currLevelStr);
      pcVar5 = (currLevelStr->_M_dataplus)._M_p;
      lVar15 = 0;
      do {
        bVar7 = base::utils::Str::cStringCaseEq(pcVar5,*(char **)((long)&stringToLevelMap + lVar15))
        ;
        if (bVar7) {
          LVar9 = *(Level *)((long)&DAT_00183108 + lVar15);
          goto LAB_0015806e;
        }
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x80);
      LVar9 = Unknown;
LAB_0015806e:
      *local_1c8 = LVar9;
    }
    goto LAB_00158818;
  }
  uVar10 = std::__cxx11::string::find((char)line,0x3d);
  iVar8 = std::__cxx11::string::compare((char *)line);
  local_21c = Unknown;
  if ((iVar8 != 0) && (bVar2 = *(line->_M_dataplus)._M_p, '@' < (char)bVar2)) {
    if (bVar2 < 0x5b) {
      if (uVar10 != 0xffffffffffffffff) {
LAB_00158099:
        if (uVar10 < line->_M_string_length) {
          uVar10 = std::__cxx11::string::find((char)line,0x3d);
          std::__cxx11::string::substr((ulong)local_1b8,(ulong)line);
          local_1f8 = uVar10;
          std::__cxx11::string::operator=((string *)currConfigStr,(string *)local_1b8);
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
          sVar3 = currConfigStr->_M_string_length;
          if (sVar3 != 0) {
            pcVar4 = (currConfigStr->_M_dataplus)._M_p;
            sVar14 = 0;
            do {
              iVar8 = toupper((int)pcVar4[sVar14]);
              pcVar4[sVar14] = (char)iVar8;
              sVar14 = sVar14 + 1;
            } while (sVar3 != sVar14);
          }
          std::__cxx11::string::_M_assign((string *)currConfigStr);
          base::utils::Str::rtrim(currConfigStr);
          base::utils::Str::ltrim(currConfigStr);
          std::__cxx11::string::_M_assign((string *)currConfigStr);
          pcVar5 = (currConfigStr->_M_dataplus)._M_p;
          lVar15 = 8;
          do {
            bVar7 = base::utils::Str::cStringCaseEq(pcVar5,*(char **)(&UNK_00183178 + lVar15));
            if (bVar7) {
              local_21c = *(ConfigurationType *)((long)&configStringToTypeMap + lVar15);
              goto LAB_0015819a;
            }
            lVar15 = lVar15 + 0x10;
          } while (lVar15 != 0xa8);
          local_21c = Unknown;
LAB_0015819a:
          std::__cxx11::string::substr((ulong)local_1b8,(ulong)line);
          std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1b8);
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
          base::utils::Str::rtrim(&local_1f0);
          base::utils::Str::ltrim(&local_1f0);
          std::__cxx11::string::_M_assign((string *)&local_1f0);
          uVar10 = std::__cxx11::string::find((char *)&local_1f0,0x16bd5d,0);
          if (uVar10 != 0xffffffffffffffff) {
            local_1d0 = uVar10 + 1;
            local_1f8 = uVar10;
            uVar10 = std::__cxx11::string::find((char *)&local_1f0,0x16bd5d,local_1d0);
            if (uVar10 != 0xffffffffffffffff) {
              do {
                uVar1 = uVar10 - 1;
                if (local_1f0._M_string_length <= uVar1) {
                  uVar12 = std::__throw_out_of_range_fmt
                                     ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                      ,uVar1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                    operator_delete(local_1f0._M_dataplus._M_p,
                                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                                             local_1f0.field_2._M_local_buf[0]) + 1);
                  }
                  _Unwind_Resume(uVar12);
                }
                if (local_1f0._M_dataplus._M_p[uVar1] != '\\') {
                  if (uVar10 <= local_1f8) {
                    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,
                               "Configuration error - No ending quote found in [",0x30);
                    poVar11 = std::ostream::_M_insert<void_const*>((ostream *)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",
                               0x2c);
                    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1ba);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,") [(quotesStart < quotesEnd)",0x1c);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,"] WITH MESSAGE \"",0x10);
                    std::__cxx11::stringbuf::str();
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar11,(char *)local_218,local_210);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
                    std::endl<char,std::char_traits<char>>(poVar11);
                    if (local_218 != local_208) {
                      operator_delete(local_218,local_208[0] + 1);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                    std::ios_base::~ios_base(local_138);
                  }
                  if (local_1d0 == uVar10) {
                    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"Empty configuration value for [",0x1f);
                    poVar11 = std::ostream::_M_insert<void_const*>((ostream *)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",
                               0x2c);
                    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1bb);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,") [(quotesStart + 1 != quotesEnd)",0x21);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,"] WITH MESSAGE \"",0x10);
                    std::__cxx11::stringbuf::str();
                    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar11,(char *)local_218,local_210);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
                    std::endl<char,std::char_traits<char>>(poVar11);
                    if (local_218 != local_208) {
                      operator_delete(local_218,local_208[0] + 1);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                    std::ios_base::~ios_base(local_138);
                  }
                  else if (local_1f8 != uVar10) {
                    std::__cxx11::string::substr((ulong)local_1b8,(ulong)&local_1f0);
                    std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_1b8);
                    if (local_1b8[0] != local_1a8) {
                      operator_delete(local_1b8[0],local_1a8[0] + 1);
                    }
                  }
                  break;
                }
                std::__cxx11::string::erase((ulong)&local_1f0,uVar1);
                std::__cxx11::string::_M_assign((string *)&local_1f0);
                uVar10 = std::__cxx11::string::find((char *)&local_1f0,0x16bd5d,uVar10 + 2);
              } while (uVar10 != 0xffffffffffffffff);
            }
          }
        }
      }
    }
    else if ((0x60 < bVar2) && (uVar10 != 0xffffffffffffffff && bVar2 < 0x7b)) goto LAB_00158099;
  }
  pLVar6 = local_1c8;
  if (*local_1c8 == Unknown) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unrecognized severity level [",0x1d);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(currLevelStr->_M_dataplus)._M_p,
                         currLevelStr->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1c2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,") [*currLevel != Level::Unknown",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] WITH MESSAGE \"",0x10);
    std::__cxx11::stringbuf::str();
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_218,local_210);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if (local_218 != local_208) {
      operator_delete(local_218,local_208[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (local_21c == Unknown) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unrecognized configuration [",0x1c);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(currConfigStr->_M_dataplus)._M_p,
                         currConfigStr->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ",0x2c);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1c3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,") [currConfig != ConfigurationType::Unknown",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] WITH MESSAGE \"",0x10);
    std::__cxx11::stringbuf::str();
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_218,local_210);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if (local_218 != local_208) {
      operator_delete(local_218,local_208[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  else if (*pLVar6 != Unknown) {
    set(local_1c0,*pLVar6,local_21c,&local_1f0);
    goto LAB_00158818;
  }
  bVar13 = false;
LAB_00158818:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                             local_1f0.field_2._M_local_buf[0]) + 1);
  }
  return bVar13;
}

Assistant:

bool Configurations::Parser::parseLine(std::string* line, std::string* currConfigStr, std::string* currLevelStr,
                                       Level* currLevel,
                                       Configurations* conf) {
  ConfigurationType currConfig = ConfigurationType::Unknown;
  std::string currValue = std::string();
  *line = base::utils::Str::trim(*line);
  if (isComment(*line)) return true;
  ignoreComments(line);
  *line = base::utils::Str::trim(*line);
  if (line->empty()) {
    // Comment ignored
    return true;
  }
  if (isLevel(*line)) {
    if (line->size() <= 2) {
      return true;
    }
    *currLevelStr = line->substr(1, line->size() - 2);
    *currLevelStr = base::utils::Str::toUpper(*currLevelStr);
    *currLevelStr = base::utils::Str::trim(*currLevelStr);
    *currLevel = LevelHelper::convertFromString(currLevelStr->c_str());
    return true;
  }
  if (isConfig(*line)) {
    std::size_t assignment = line->find('=');
    *currConfigStr = line->substr(0, assignment);
    *currConfigStr = base::utils::Str::toUpper(*currConfigStr);
    *currConfigStr = base::utils::Str::trim(*currConfigStr);
    currConfig = ConfigurationTypeHelper::convertFromString(currConfigStr->c_str());
    currValue = line->substr(assignment + 1);
    currValue = base::utils::Str::trim(currValue);
    std::size_t quotesStart = currValue.find("\"", 0);
    std::size_t quotesEnd = std::string::npos;
    if (quotesStart != std::string::npos) {
      quotesEnd = currValue.find("\"", quotesStart + 1);
      while (quotesEnd != std::string::npos && currValue.at(quotesEnd - 1) == '\\') {
        currValue = currValue.erase(quotesEnd - 1, 1);
        quotesEnd = currValue.find("\"", quotesEnd + 2);
      }
    }
    if (quotesStart != std::string::npos && quotesEnd != std::string::npos) {
      // Quote provided - check and strip if valid
      ELPP_ASSERT((quotesStart < quotesEnd), "Configuration error - No ending quote found in ["
                  << currConfigStr << "]");
      ELPP_ASSERT((quotesStart + 1 != quotesEnd), "Empty configuration value for [" << currConfigStr << "]");
      if ((quotesStart != quotesEnd) && (quotesStart + 1 != quotesEnd)) {
        // Explicit check in case if assertion is disabled
        currValue = currValue.substr(quotesStart + 1, quotesEnd - 1);
      }
    }
  }
  ELPP_ASSERT(*currLevel != Level::Unknown, "Unrecognized severity level [" << *currLevelStr << "]");
  ELPP_ASSERT(currConfig != ConfigurationType::Unknown, "Unrecognized configuration [" << *currConfigStr << "]");
  if (*currLevel == Level::Unknown || currConfig == ConfigurationType::Unknown) {
    return false;  // unrecognizable level or config
  }
  conf->set(*currLevel, currConfig, currValue);
  return true;
}